

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O2

int re2::RE2::MaxSubmatch(StringPiece *rewrite)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  
  pcVar3 = rewrite->data_;
  pcVar4 = pcVar3 + rewrite->size_;
  uVar2 = 0;
  for (; pcVar3 < pcVar4; pcVar3 = pcVar3 + 1) {
    if ((*pcVar3 == '\\') && (pcVar3 = pcVar3 + 1, pcVar3 < pcVar4)) {
      uVar5 = (int)*pcVar3 - 0x30;
      uVar1 = uVar2;
      if ((int)uVar2 < (int)uVar5) {
        uVar1 = uVar5;
      }
      if (uVar5 < 10) {
        uVar2 = uVar1;
      }
    }
  }
  return uVar2;
}

Assistant:

const_pointer data() const { return data_; }